

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

string * re2::RE2::QuoteMeta_abi_cxx11_(StringPiece *unquoted)

{
  size_type sVar1;
  const_reference pcVar2;
  StringPiece *in_RSI;
  string *in_RDI;
  size_t ii;
  string *result;
  ulong local_30;
  
  std::__cxx11::string::string((string *)in_RDI);
  StringPiece::size(in_RSI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_30 = 0;
  do {
    sVar1 = StringPiece::size(in_RSI);
    if (sVar1 <= local_30) {
      return in_RDI;
    }
    pcVar2 = StringPiece::operator[](in_RSI,local_30);
    if (((((*pcVar2 < 'a') || (pcVar2 = StringPiece::operator[](in_RSI,local_30), 'z' < *pcVar2)) &&
         ((pcVar2 = StringPiece::operator[](in_RSI,local_30), *pcVar2 < 'A' ||
          (pcVar2 = StringPiece::operator[](in_RSI,local_30), 'Z' < *pcVar2)))) &&
        (((pcVar2 = StringPiece::operator[](in_RSI,local_30), *pcVar2 < '0' ||
          (pcVar2 = StringPiece::operator[](in_RSI,local_30), '9' < *pcVar2)) &&
         (pcVar2 = StringPiece::operator[](in_RSI,local_30), *pcVar2 != '_')))) &&
       (pcVar2 = StringPiece::operator[](in_RSI,local_30), ((int)*pcVar2 & 0x80U) == 0)) {
      pcVar2 = StringPiece::operator[](in_RSI,local_30);
      if (*pcVar2 != '\0') {
        std::__cxx11::string::operator+=((string *)in_RDI,'\\');
        goto LAB_00226e76;
      }
      std::__cxx11::string::operator+=((string *)in_RDI,"\\x00");
    }
    else {
LAB_00226e76:
      pcVar2 = StringPiece::operator[](in_RSI,local_30);
      std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

std::string RE2::QuoteMeta(const StringPiece& unquoted) {
  std::string result;
  result.reserve(unquoted.size() << 1);

  // Escape any ascii character not in [A-Za-z_0-9].
  //
  // Note that it's legal to escape a character even if it has no
  // special meaning in a regular expression -- so this function does
  // that.  (This also makes it identical to the perl function of the
  // same name except for the null-character special case;
  // see `perldoc -f quotemeta`.)
  for (size_t ii = 0; ii < unquoted.size(); ++ii) {
    // Note that using 'isalnum' here raises the benchmark time from
    // 32ns to 58ns:
    if ((unquoted[ii] < 'a' || unquoted[ii] > 'z') &&
        (unquoted[ii] < 'A' || unquoted[ii] > 'Z') &&
        (unquoted[ii] < '0' || unquoted[ii] > '9') &&
        unquoted[ii] != '_' &&
        // If this is the part of a UTF8 or Latin1 character, we need
        // to copy this byte without escaping.  Experimentally this is
        // what works correctly with the regexp library.
        !(unquoted[ii] & 128)) {
      if (unquoted[ii] == '\0') {  // Special handling for null chars.
        // Note that this special handling is not strictly required for RE2,
        // but this quoting is required for other regexp libraries such as
        // PCRE.
        // Can't use "\\0" since the next character might be a digit.
        result += "\\x00";
        continue;
      }
      result += '\\';
    }
    result += unquoted[ii];
  }

  return result;
}